

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

ON_ModelComponentReference __thiscall
ONX_Model::AddModelComponentForExperts
          (ONX_Model *this,ON_ModelComponent *model_component,bool bManagedComponent,
          bool bResolveIdAndNameConflicts,bool bUpdateComponentIdentification)

{
  undefined8 uVar1;
  Type component_type_00;
  bool bVar2;
  ON_UUID *pOVar3;
  wchar_t *candidate_name;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  byte in_R9B;
  ON_ModelComponentReference OVar5;
  ON_UUID id_00;
  ON_UUID name_parent_id;
  bool local_e1;
  undefined1 local_68 [32];
  ON_wString name;
  ON_UUID id;
  ON_UUID parent_id;
  Type component_type;
  bool bUpdateComponentIdentification_local;
  bool bResolveIdAndNameConflicts_local;
  bool bManagedComponent_local;
  ON_ModelComponent *model_component_local;
  ONX_Model *this_local;
  
  id_00._0_8_ = (ON_ModelComponent *)CONCAT71(in_register_00000011,bManagedComponent);
  if (id_00._0_8_ == (ON_ModelComponent *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
               ,0x59c,"","model_component parameter is nullptr.");
    ON_ModelComponentReference::ON_ModelComponentReference
              ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    component_type_00 = ON_ModelComponent::ComponentType(id_00._0_8_);
    bVar2 = ON_ModelComponent::ComponentTypeIsValidAndNotMixed(component_type_00);
    if (bVar2) {
      pOVar3 = ON_ModelComponent::ParentId(id_00._0_8_);
      id.Data4 = *(uchar (*) [8])pOVar3;
      uVar1 = *(undefined8 *)pOVar3->Data4;
      name.m_s = (wchar_t *)0;
      id._0_8_ = (uchar  [8])0x0;
      ON_wString::ON_wString((ON_wString *)(local_68 + 0x18));
      pOVar3 = ON_ModelComponent::Id(id_00._0_8_);
      ON_ModelComponent::Name((ON_ModelComponent *)local_68);
      candidate_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_68);
      local_e1 = false;
      if (bUpdateComponentIdentification) {
        local_e1 = (bool)(in_R9B & 1);
      }
      bVar2 = ValdateComponentIdAndName
                        ((ONX_Model *)model_component,component_type_00,pOVar3,(ON_UUID *)id.Data4,
                         candidate_name,bUpdateComponentIdentification,local_e1,(ON_UUID *)&name,
                         (ON_wString *)(local_68 + 0x18));
      ON_wString::~ON_wString((ON_wString *)local_68);
      if (bVar2) {
        id_00.Data4 = (uchar  [8])name.m_s;
        name_parent_id.Data4 = (uchar  [8])((long)local_68 + 0x18);
        name_parent_id.Data1 = id.Data1;
        name_parent_id.Data2 = id.Data2;
        name_parent_id.Data3 = id.Data3;
        Internal_AddModelComponent
                  (this,model_component,id_00,name_parent_id,(ON_wString *)id.Data4,SUB81(uVar1,0),
                   bResolveIdAndNameConflicts);
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                   ,0x5ac,"","Invalid model_component id or name.");
        ON_ModelComponentReference::ON_ModelComponentReference
                  ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
      }
      ON_wString::~ON_wString((ON_wString *)(local_68 + 0x18));
      _Var4._M_pi = extraout_RDX_01;
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                 ,0x5a3,"","Invalid model_component->ComponentType() value.");
      ON_ModelComponentReference::ON_ModelComponentReference
                ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
      _Var4._M_pi = extraout_RDX_00;
    }
  }
  OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::AddModelComponentForExperts(
  ON_ModelComponent* model_component,
  bool bManagedComponent,
  bool bResolveIdAndNameConflicts,
  bool bUpdateComponentIdentification
  )
{
  if (nullptr == model_component)
  {
    ON_ERROR("model_component parameter is nullptr.");
    return ON_ModelComponentReference::Empty;
  }

  const ON_ModelComponent::Type component_type = model_component->ComponentType();
  if (!ON_ModelComponent::ComponentTypeIsValidAndNotMixed(component_type))
  {
    ON_ERROR("Invalid model_component->ComponentType() value.");
    return ON_ModelComponentReference::Empty;
  }

  const ON_UUID parent_id = model_component->ParentId();
  ON_UUID id = ON_nil_uuid;
  ON_wString name;
  if (false == ValdateComponentIdAndName(component_type, model_component->Id(), parent_id, model_component->Name(), bResolveIdAndNameConflicts, bResolveIdAndNameConflicts && bUpdateComponentIdentification, id, name))
  {
    ON_ERROR("Invalid model_component id or name.");
    return ON_ModelComponentReference::Empty;
  }

  return Internal_AddModelComponent(model_component, id, parent_id, name, bManagedComponent, bUpdateComponentIdentification);
}